

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceFinder.cpp
# Opt level: O3

void __thiscall OpenMD::DistanceFinder::DistanceFinder(DistanceFinder *this,SimInfo *info)

{
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *this_00;
  Atom *pAVar1;
  RigidBody *pRVar2;
  Bond *pBVar3;
  Bend *pBVar4;
  Torsion *pTVar5;
  Inversion *pIVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  SimInfo *pSVar8;
  Molecule *pMVar9;
  int *piVar10;
  pointer ppAVar11;
  pointer ppRVar12;
  pointer ppBVar13;
  pointer ppBVar14;
  pointer ppTVar15;
  pointer ppIVar16;
  iterator iVar17;
  MoleculeIterator mi;
  MoleculeIterator local_50 [2];
  vector<int,_std::allocator<int>_> *local_40;
  vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *local_38;
  
  this->info_ = info;
  this_00 = &this->stuntdoubles_;
  local_38 = &this->molecules_;
  local_40 = &this->nObjects_;
  memset(this_00,0,0xa8);
  local_50[0]._M_node._0_4_ = info->nGlobalRigidBodies_ + info->nGlobalAtoms_;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (local_40,(iterator)0x0,(int *)local_50);
  pSVar8 = this->info_;
  iVar17._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_50[0]._M_node._0_4_ = pSVar8->nGlobalBonds_;
  piVar10 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar17._M_current == piVar10) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_40,iVar17,(int *)local_50);
    pSVar8 = this->info_;
    iVar17._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar10 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar17._M_current = (int)local_50[0]._M_node;
    iVar17._M_current = iVar17._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar17._M_current;
  }
  local_50[0]._M_node._0_4_ = pSVar8->nGlobalBends_;
  if (iVar17._M_current == piVar10) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_40,iVar17,(int *)local_50);
    pSVar8 = this->info_;
    iVar17._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar10 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar17._M_current = (int)local_50[0]._M_node;
    iVar17._M_current = iVar17._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar17._M_current;
  }
  local_50[0]._M_node._0_4_ = pSVar8->nGlobalTorsions_;
  if (iVar17._M_current == piVar10) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_40,iVar17,(int *)local_50);
    pSVar8 = this->info_;
    iVar17._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar10 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar17._M_current = (int)local_50[0]._M_node;
    iVar17._M_current = iVar17._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar17._M_current;
  }
  local_50[0]._M_node._0_4_ = pSVar8->nGlobalInversions_;
  if (iVar17._M_current == piVar10) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_40,iVar17,(int *)local_50);
    pSVar8 = this->info_;
    iVar17._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar10 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar17._M_current = (int)local_50[0]._M_node;
    iVar17._M_current = iVar17._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar17._M_current;
  }
  pvVar7 = local_40;
  local_50[0]._M_node._0_4_ = pSVar8->nGlobalMols_;
  if (iVar17._M_current == piVar10) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_40,iVar17,(int *)local_50);
  }
  else {
    *iVar17._M_current = pSVar8->nGlobalMols_;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar17._M_current + 1;
  }
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::resize
            (this_00,(long)*(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::resize
            (&this->bonds_,
             (long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[1]);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::resize
            (&this->bends_,
             (long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[2]);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::resize
            (&this->torsions_,
             (long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[3]);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::resize
            (&this->inversions_,
             (long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[4]);
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::resize
            (local_38,(long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[5]);
  local_50[0]._M_node = (_Base_ptr)0x0;
  pMVar9 = SimInfo::beginMolecule(this->info_,local_50);
  do {
    if (pMVar9 == (Molecule *)0x0) {
      return;
    }
    (local_38->super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>)._M_impl.
    super__Vector_impl_data._M_start[pMVar9->globalIndex_] = pMVar9;
    ppAVar11 = (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar11 !=
        (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      pAVar1 = *ppAVar11;
      while (pAVar1 != (Atom *)0x0) {
        ppAVar11 = ppAVar11 + 1;
        (this_00->super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>)
        ._M_impl.super__Vector_impl_data._M_start[(pAVar1->super_StuntDouble).globalIndex_] =
             &pAVar1->super_StuntDouble;
        if (ppAVar11 ==
            (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        pAVar1 = *ppAVar11;
      }
    }
    ppRVar12 = (pMVar9->rigidBodies_).
               super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppRVar12 !=
        (pMVar9->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pRVar2 = *ppRVar12;
      while (pRVar2 != (RigidBody *)0x0) {
        ppRVar12 = ppRVar12 + 1;
        (this_00->super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>)
        ._M_impl.super__Vector_impl_data._M_start[(pRVar2->super_StuntDouble).globalIndex_] =
             &pRVar2->super_StuntDouble;
        if (ppRVar12 ==
            (pMVar9->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_finish) break;
        pRVar2 = *ppRVar12;
      }
    }
    ppBVar13 = (pMVar9->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar13 !=
        (pMVar9->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      pBVar3 = *ppBVar13;
      while (pBVar3 != (Bond *)0x0) {
        ppBVar13 = ppBVar13 + 1;
        (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
        super__Vector_impl_data._M_start[(pBVar3->super_ShortRangeInteraction).globalIndex_] =
             pBVar3;
        if (ppBVar13 ==
            (pMVar9->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        pBVar3 = *ppBVar13;
      }
    }
    ppBVar14 = (pMVar9->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar14 !=
        (pMVar9->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      pBVar4 = *ppBVar14;
      while (pBVar4 != (Bend *)0x0) {
        ppBVar14 = ppBVar14 + 1;
        (this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
        super__Vector_impl_data._M_start[(pBVar4->super_ShortRangeInteraction).globalIndex_] =
             pBVar4;
        if (ppBVar14 ==
            (pMVar9->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        pBVar4 = *ppBVar14;
      }
    }
    ppTVar15 = (pMVar9->torsions_).
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppTVar15 !=
        (pMVar9->torsions_).
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pTVar5 = *ppTVar15;
      while (pTVar5 != (Torsion *)0x0) {
        ppTVar15 = ppTVar15 + 1;
        (this->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
        _M_impl.super__Vector_impl_data._M_start[(pTVar5->super_ShortRangeInteraction).globalIndex_]
             = pTVar5;
        if (ppTVar15 ==
            (pMVar9->torsions_).
            super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
            super__Vector_impl_data._M_finish) break;
        pTVar5 = *ppTVar15;
      }
    }
    ppIVar16 = (pMVar9->inversions_).
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppIVar16 !=
        (pMVar9->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pIVar6 = *ppIVar16;
      while (pIVar6 != (Inversion *)0x0) {
        ppIVar16 = ppIVar16 + 1;
        (this->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_start[(pIVar6->super_ShortRangeInteraction).globalIndex_] =
             pIVar6;
        if (ppIVar16 ==
            (pMVar9->inversions_).
            super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
            super__Vector_impl_data._M_finish) break;
        pIVar6 = *ppIVar16;
      }
    }
    pMVar9 = SimInfo::nextMolecule(this->info_,local_50);
  } while( true );
}

Assistant:

DistanceFinder::DistanceFinder(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    stuntdoubles_.resize(nObjects_[STUNTDOUBLE]);
    bonds_.resize(nObjects_[BOND]);
    bends_.resize(nObjects_[BEND]);
    torsions_.resize(nObjects_[TORSION]);
    inversions_.resize(nObjects_[INVERSION]);
    molecules_.resize(nObjects_[MOLECULE]);

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      molecules_[mol->getGlobalIndex()] = mol;

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        stuntdoubles_[atom->getGlobalIndex()] = atom;
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        stuntdoubles_[rb->getGlobalIndex()] = rb;
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bonds_[bond->getGlobalIndex()] = bond;
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        bends_[bend->getGlobalIndex()] = bend;
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        torsions_[torsion->getGlobalIndex()] = torsion;
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        inversions_[inversion->getGlobalIndex()] = inversion;
      }
    }
  }